

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int duckdb_je_ctl_byname(tsd_t *tsd,char *name,void *oldp,size_t *oldlenp,void *newp,size_t newlen)

{
  _Bool _Var1;
  int iVar2;
  ctl_named_node_t *node;
  size_t depth;
  size_t mib [7];
  ctl_named_node_t *local_78;
  size_t local_70;
  size_t local_68 [7];
  
  if ((ctl_initialized == '\0') && (_Var1 = ctl_init(tsd), _Var1)) {
    return 0xb;
  }
  local_70 = 7;
  iVar2 = ctl_lookup((tsdn_t *)tsd,super_root_node,name,&local_78,local_68,&local_70);
  if (((iVar2 == 0) && (iVar2 = 2, local_78 != (ctl_named_node_t *)0x0)) &&
     (local_78->ctl !=
      (_func_int_tsd_t_ptr_size_t_ptr_size_t_void_ptr_size_t_ptr_void_ptr_size_t *)0x0)) {
    iVar2 = (*local_78->ctl)(tsd,local_68,local_70,oldp,oldlenp,newp,newlen);
  }
  return iVar2;
}

Assistant:

int
ctl_byname(tsd_t *tsd, const char *name, void *oldp, size_t *oldlenp,
    void *newp, size_t newlen) {
	int ret;
	size_t depth;
	size_t mib[CTL_MAX_DEPTH];
	const ctl_named_node_t *node;

	if (!ctl_initialized && ctl_init(tsd)) {
		ret = EAGAIN;
		goto label_return;
	}

	depth = CTL_MAX_DEPTH;
	ret = ctl_lookup(tsd_tsdn(tsd), super_root_node, name, &node, mib,
	    &depth);
	if (ret != 0) {
		goto label_return;
	}

	if (node != NULL && node->ctl) {
		ret = node->ctl(tsd, mib, depth, oldp, oldlenp, newp, newlen);
	} else {
		/* The name refers to a partial path through the ctl tree. */
		ret = ENOENT;
	}

label_return:
	return(ret);
}